

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O2

string * directories::MADPGetResultsDir
                   (string *__return_storage_ptr__,string *method,
                   MultiAgentDecisionProcessInterface *problem)

{
  string sStack_38;
  
  (*problem->_vptr_MultiAgentDecisionProcessInterface[4])(&sStack_38,problem);
  MADPGetResultsDir(__return_storage_ptr__,method,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

string
directories::MADPGetResultsDir(const string & method,
                               const MultiAgentDecisionProcessInterface
                               *problem)
{
    return(MADPGetResultsDir(method,problem->GetUnixName()));
}